

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtranslator.cpp
# Opt level: O0

bool __thiscall
QTranslatorPrivate::do_load(QTranslatorPrivate *this,uchar *data,qsizetype len,QString *directory)

{
  quint8 qVar1;
  bool bVar2;
  quint32 qVar3;
  long lVar4;
  QString *search_delimiters;
  const_iterator o;
  QString *in_RDX;
  long in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *dependency;
  add_const_t<QList<QString>_> *__range2;
  quint32 blockLen;
  quint8 tag;
  uchar *end;
  bool ok;
  __single_object translator;
  const_iterator __end2;
  const_iterator __begin2;
  QString dep;
  QStringList dependencies;
  QDataStream stream;
  QString *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  qsizetype in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  QByteArray *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  undefined6 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb6;
  quint32 qVar5;
  undefined4 in_stack_fffffffffffffebc;
  int local_134;
  bool local_f9;
  undefined1 *puVar6;
  QString *directory_00;
  QString *in_stack_ffffffffffffff28;
  QTranslator *in_stack_ffffffffffffff30;
  const_iterator local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  QList<QString> local_40;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_f9 = true;
  lVar4 = (long)&(in_RDX->d).d + in_RSI;
  search_delimiters = (QString *)(in_RSI + 0x10);
  local_40.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_40.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_40.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  directory_00 = in_RDI;
  QList<QString>::QList((QList<QString> *)0x42f507);
  for (; search_delimiters < (QString *)(lVar4 - 5U);
      search_delimiters = (QString *)((long)&(search_delimiters->d).d + (ulong)qVar3)) {
    puVar6 = (undefined1 *)((long)&(search_delimiters->d).d + 1);
    qVar1 = read8((uchar *)0x42f53f);
    in_stack_fffffffffffffebc = CONCAT13(qVar1,(int3)in_stack_fffffffffffffebc);
    qVar3 = read32((uchar *)0x42f55d);
    search_delimiters = (QString *)(puVar6 + 4);
    if ((qVar1 == '\0') || (qVar3 == 0)) break;
    if ((uint)((int)lVar4 - (int)search_delimiters) < qVar3) {
      local_f9 = false;
      break;
    }
    if (qVar1 == 0xa7) {
      QString::fromUtf8(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                         in_stack_fffffffffffffe58);
      QString::~QString((QString *)0x42f636);
    }
    else if (qVar1 == '/') {
      in_RDI[8].d.d = (Data *)search_delimiters;
      *(quint32 *)&in_RDI[9].d.d = qVar3;
    }
    else if (qVar1 == 'B') {
      in_RDI[7].d.size = (qsizetype)search_delimiters;
      *(quint32 *)((long)&in_RDI[8].d.size + 4) = qVar3;
    }
    else if (qVar1 == 'i') {
      in_RDI[7].d.ptr = (char16_t *)search_delimiters;
      *(quint32 *)&in_RDI[8].d.size = qVar3;
    }
    else if (qVar1 == 0x88) {
      in_RDI[8].d.ptr = (char16_t *)search_delimiters;
      *(quint32 *)((long)&in_RDI[9].d.d + 4) = qVar3;
    }
    else if (qVar1 == 0x96) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
      qVar5 = qVar3;
      QByteArray::fromRawData(in_stack_fffffffffffffe88,(qsizetype)in_stack_fffffffffffffe80);
      QDataStream::QDataStream
                ((QDataStream *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                 in_stack_fffffffffffffe98);
      QByteArray::~QByteArray((QByteArray *)0x42f77e);
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      QString::QString((QString *)0x42f7b8);
      while (bVar2 = QDataStream::atEnd((QDataStream *)
                                        CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60
                                                )), ((bVar2 ^ 0xffU) & 1) != 0) {
        ::operator>>((QDataStream *)CONCAT44(in_stack_fffffffffffffebc,qVar5),
                     (QString *)
                     CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0)));
        QList<QString>::append
                  ((QList<QString> *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                   in_stack_fffffffffffffe58);
      }
      QString::~QString((QString *)0x42f878);
      QDataStream::~QDataStream
                ((QDataStream *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    }
  }
  if ((local_f9 != false) &&
     (bVar2 = isValidNumerusRules((uchar *)in_RDI[8].d.ptr,*(uint *)((long)&in_RDI[9].d.d + 4)),
     !bVar2)) {
    local_f9 = false;
  }
  if (local_f9 != false) {
    QList<QString>::size(&local_40);
    std::
    vector<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
    ::reserve((vector<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
              (size_type)in_stack_fffffffffffffe88);
    local_90.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_90 = QList<QString>::begin
                         ((QList<QString> *)
                          CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    o = QList<QString>::end((QList<QString> *)
                            CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    while (bVar2 = QList<QString>::const_iterator::operator!=(&local_90,o), bVar2) {
      QList<QString>::const_iterator::operator*(&local_90);
      std::make_unique<QTranslator>();
      std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>::operator->
                ((unique_ptr<QTranslator,_std::default_delete<QTranslator>_> *)0x42fa20);
      QString::QString((QString *)0x42fa4e);
      QString::QString((QString *)0x42fa60);
      local_f9 = QTranslator::load(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,directory_00,
                                   search_delimiters,in_RDX);
      QString::~QString((QString *)0x42fa9e);
      QString::~QString((QString *)0x42faab);
      if (local_f9) {
        std::
        vector<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
        ::push_back((vector<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                    (value_type *)in_stack_fffffffffffffe58);
        local_134 = 0;
      }
      else {
        local_134 = 6;
      }
      std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>::~unique_ptr
                ((unique_ptr<QTranslator,_std::default_delete<QTranslator>_> *)
                 CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
      if (local_134 != 0) break;
      QList<QString>::const_iterator::operator++(&local_90);
    }
    if (local_f9 == false) {
      std::
      vector<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
      ::clear((vector<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
               *)0x42fb8a);
    }
  }
  if (local_f9 == false) {
    in_RDI[7].d.ptr = (char16_t *)0x0;
    in_RDI[8].d.d = (Data *)0x0;
    in_RDI[7].d.size = 0;
    in_RDI[8].d.ptr = (char16_t *)0x0;
    *(undefined4 *)&in_RDI[8].d.size = 0;
    *(undefined4 *)&in_RDI[9].d.d = 0;
    *(undefined4 *)((long)&in_RDI[8].d.size + 4) = 0;
    *(undefined4 *)((long)&in_RDI[9].d.d + 4) = 0;
  }
  QList<QString>::~QList((QList<QString> *)0x42fc0f);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_f9 & 1);
}

Assistant:

bool QTranslatorPrivate::do_load(const uchar *data, qsizetype len, const QString &directory)
{
    bool ok = true;
    const uchar *end = data + len;

    data += MagicLength;

    QStringList dependencies;
    while (data < end - 5) {
        quint8 tag = read8(data++);
        quint32 blockLen = read32(data);
        data += 4;
        if (!tag || !blockLen)
            break;
        if (quint32(end - data) < blockLen) {
            ok = false;
            break;
        }

        if (tag == QTranslatorPrivate::Language) {
            language = QString::fromUtf8((const char *)data, blockLen);
        } else if (tag == QTranslatorPrivate::Contexts) {
            contextArray = data;
            contextLength = blockLen;
        } else if (tag == QTranslatorPrivate::Hashes) {
            offsetArray = data;
            offsetLength = blockLen;
        } else if (tag == QTranslatorPrivate::Messages) {
            messageArray = data;
            messageLength = blockLen;
        } else if (tag == QTranslatorPrivate::NumerusRules) {
            numerusRulesArray = data;
            numerusRulesLength = blockLen;
        } else if (tag == QTranslatorPrivate::Dependencies) {
            QDataStream stream(QByteArray::fromRawData((const char*)data, blockLen));
            QString dep;
            while (!stream.atEnd()) {
                stream >> dep;
                dependencies.append(dep);
            }
        }

        data += blockLen;
    }

    if (ok && !isValidNumerusRules(numerusRulesArray, numerusRulesLength))
        ok = false;
    if (ok) {
        subTranslators.reserve(std::size_t(dependencies.size()));
        for (const QString &dependency : std::as_const(dependencies)) {
            auto translator = std::make_unique<QTranslator>();
            ok = translator->load(dependency, directory);
            if (!ok)
                break;
            subTranslators.push_back(std::move(translator));
        }

        // In case some dependencies fail to load, unload all the other ones too.
        if (!ok)
            subTranslators.clear();
    }

    if (!ok) {
        messageArray = nullptr;
        contextArray = nullptr;
        offsetArray = nullptr;
        numerusRulesArray = nullptr;
        messageLength = 0;
        contextLength = 0;
        offsetLength = 0;
        numerusRulesLength = 0;
    }

    return ok;
}